

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkparser.cpp
# Opt level: O0

void __thiscall
LinkParser::parseReaction
          (LinkParser *this,Link *link,int type,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *tokenList)

{
  bool bVar1;
  int iVar2;
  InputError *this_00;
  string local_60 [32];
  reference local_40;
  string *tokens;
  double x;
  Pipe *pipe;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *tokenList_local;
  Link *pLStack_18;
  int type_local;
  Link *link_local;
  LinkParser *this_local;
  
  pipe = (Pipe *)tokenList;
  tokenList_local._4_4_ = type;
  pLStack_18 = link;
  link_local = (Link *)this;
  iVar2 = (*(link->super_Element)._vptr_Element[2])();
  if (iVar2 == 0) {
    x = (double)pLStack_18;
    local_40 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)pipe,0);
    bVar1 = Utilities::parseNumber<double>(local_40 + 0x40,(double *)&tokens);
    if (!bVar1) {
      this_00 = (InputError *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string(local_60,(string *)(local_40 + 0x20));
      InputError::InputError(this_00,6,(string *)local_60);
      __cxa_throw(this_00,&InputError::typeinfo,InputError::~InputError);
    }
    if (tokenList_local._4_4_ == 0) {
      *(string **)((long)x + 0xd0) = tokens;
    }
    else if (tokenList_local._4_4_ == 1) {
      *(string **)((long)x + 0xd8) = tokens;
    }
  }
  return;
}

Assistant:

void LinkParser::parseReaction(Link* link, int type, vector<string>& tokenList)
{
    // Contents of tokenList are:
    // 0 - BULK/WALL keyword
    // 1 - link ID
    // 2 - reaction coeff. (1/days)

    // ... cast link to a pipe (only pipe links have reactions)

    if ( link->type() != Link::PIPE ) return;
    Pipe* pipe = static_cast<Pipe*>(link);

    // ... read reaction coeff.

    double x;
    string* tokens = &tokenList[0];
    if ( !Utilities::parseNumber(tokens[2], x) )
    {
        throw InputError(InputError::INVALID_NUMBER, tokens[1]);
    }

    // ... save reaction coeff.

    if      (type == Link::BULK) pipe->bulkCoeff = x;
    else if (type == Link::WALL) pipe->wallCoeff = x;
}